

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kernel_svm.cc
# Opt level: O3

void free_svm_model(svm_model *model)

{
  float *pfVar1;
  svm_example **ppsVar2;
  ulong uVar3;
  
  if (model->num_support != 0) {
    uVar3 = 0;
    do {
      svm_example::~svm_example((model->support_vec)._begin[uVar3]);
      ppsVar2 = (model->support_vec)._begin;
      if (ppsVar2[uVar3] != (svm_example *)0x0) {
        free(ppsVar2[uVar3]);
        ppsVar2 = (model->support_vec)._begin;
      }
      ppsVar2[uVar3] = (svm_example *)0x0;
      uVar3 = uVar3 + 1;
    } while (uVar3 < model->num_support);
  }
  ppsVar2 = (model->support_vec)._begin;
  if (ppsVar2 != (svm_example **)0x0) {
    free(ppsVar2);
  }
  (model->support_vec)._begin = (svm_example **)0x0;
  (model->support_vec)._end = (svm_example **)0x0;
  (model->support_vec).end_array = (svm_example **)0x0;
  pfVar1 = (model->alpha)._begin;
  if (pfVar1 != (float *)0x0) {
    free(pfVar1);
  }
  (model->alpha)._begin = (float *)0x0;
  (model->alpha)._end = (float *)0x0;
  (model->alpha).end_array = (float *)0x0;
  pfVar1 = (model->delta)._begin;
  if (pfVar1 != (float *)0x0) {
    free(pfVar1);
  }
  free(model);
  return;
}

Assistant:

void free_svm_model(svm_model* model)
{
  for (size_t i = 0; i < model->num_support; i++)
  {
    model->support_vec[i]->~svm_example();
    // Warning C6001 is triggered by the following:
    // example is allocated using (a) '&calloc_or_throw<svm_example>()' and freed using (b)
    // 'free(model->support_vec[i])'
    //
    // When the call to allocation is replaced by (a) 'new svm_example()' and deallocated using (b) 'operator delete
    // (model->support_vect[i])', the warning goes away. Disable SDL warning.
    //    #pragma warning(disable:6001)
    free_it(model->support_vec[i]);
    //  #pragma warning(default:6001)

    model->support_vec[i] = 0;
  }

  model->support_vec.delete_v();
  model->alpha.delete_v();
  model->delta.delete_v();
  free(model);
}